

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::eval::
Binary_Operator_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::do_oper
          (Binary_Operator_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>
           *this,Dispatch_State *t_ss,Opers t_oper,string *t_oper_string,Boxed_Value *t_lhs,
          Boxed_Value *t_rhs)

{
  undefined4 in_register_00000014;
  size_t *psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  Function_Push_Pop fpp;
  long lVar3;
  Boxed_Value BVar4;
  string_view t_name;
  long *in_stack_00000008;
  array<chaiscript::Boxed_Value,_2UL> params;
  undefined8 uStack_90;
  element_type *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  long local_78;
  long local_70;
  undefined1 *local_68;
  Conversion_Saves *local_60;
  anon_class_24_3_1b4046b4 local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  psVar1 = (size_t *)CONCAT44(in_register_00000014,t_oper);
  local_48.t_oper = (Opers)t_oper_string;
  if (((local_48.t_oper == invalid) ||
      (((((t_rhs->m_data).
          super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        m_type_info).m_flags & 0x10) == 0)) || ((*(byte *)(*in_stack_00000008 + 0x10) & 0x10) == 0))
  {
    chaiscript::detail::Dispatch_Engine::new_function_call
              ((Dispatch_Engine *)*psVar1,(Stack_Holder *)psVar1[1],(Conversion_Saves *)psVar1[3]);
    local_88 = (t_rhs->m_data).
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_80 = (t_rhs->m_data).
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
    if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_80->_M_use_count = local_80->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_80->_M_use_count = local_80->_M_use_count + 1;
      }
    }
    local_78 = *in_stack_00000008;
    local_70 = in_stack_00000008[1];
    if (local_70 != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(local_70 + 8) = *(int *)(local_70 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(local_70 + 8) = *(int *)(local_70 + 8) + 1;
      }
    }
    local_68 = (undefined1 *)&local_88;
    local_60 = (Conversion_Saves *)&local_68;
    chaiscript::detail::Dispatch_Engine::save_function_params
              ((Dispatch_Engine *)*psVar1,(Function_Params *)&local_68);
    t_name._M_str =
         (char *)(t_lhs->m_data).
                 super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
    t_name._M_len = *psVar1;
    local_68 = (undefined1 *)&local_88;
    local_60 = (Conversion_Saves *)&local_68;
    chaiscript::detail::Dispatch_Engine::call_function
              ((Dispatch_Engine *)this,t_name,
               (atomic_uint_fast32_t *)
               (t_lhs->m_data).
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (Function_Params *)&t_ss[3].m_conversions,(Type_Conversions_State *)&local_68);
    lVar3 = 0x20;
    do {
      if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_90 + lVar3) !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_90 + lVar3));
      }
      lVar3 = lVar3 + -0x10;
    } while (lVar3 != 0);
    chaiscript::detail::Dispatch_Engine::pop_function_call
              ((Dispatch_Engine *)*psVar1,(Stack_Holder *)psVar1[1],(Conversion_Saves *)psVar1[3]);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    local_48.t_lhs = t_rhs;
    BVar4 = Boxed_Number::
            visit<chaiscript::Boxed_Number::oper(chaiscript::Operators::Opers,chaiscript::Boxed_Value_const&,chaiscript::Boxed_Value_const&)::_lambda(auto:1_const&)_1_&>
                      ((Boxed_Number *)this,t_rhs,&local_48);
    _Var2._M_pi = BVar4.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value do_oper(const chaiscript::detail::Dispatch_State &t_ss,
                          Operators::Opers t_oper,
                          const std::string &t_oper_string,
                          const Boxed_Value &t_lhs,
                          const Boxed_Value &t_rhs) const {
        try {
          if (t_oper != Operators::Opers::invalid && t_lhs.get_type_info().is_arithmetic() && t_rhs.get_type_info().is_arithmetic()) {
            // If it's an arithmetic operation we want to short circuit dispatch
            try {
              return Boxed_Number::do_oper(t_oper, t_lhs, t_rhs);
            } catch (const chaiscript::exception::arithmetic_error &) {
              throw;
            } catch (...) {
              throw exception::eval_error("Error with numeric operator calling: " + t_oper_string);
            }
          } else {
            chaiscript::eval::detail::Function_Push_Pop fpp(t_ss);
            std::array<Boxed_Value, 2> params{t_lhs, t_rhs};
            fpp.save_params(Function_Params(params));
            return t_ss->call_function(t_oper_string, m_loc, Function_Params(params), t_ss.conversions());
          }
        } catch (const exception::dispatch_error &e) {
          throw exception::eval_error("Can not find appropriate '" + t_oper_string + "' operator.", e.parameters, e.functions, false, *t_ss);
        }
      }